

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralSurfaceMemberVarying::~IfcStructuralSurfaceMemberVarying
          (IfcStructuralSurfaceMemberVarying *this)

{
  ~IfcStructuralSurfaceMemberVarying
            ((IfcStructuralSurfaceMemberVarying *)
             &this[-1].super_IfcStructuralSurfaceMember.super_IfcStructuralMember.
              super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x48);
  return;
}

Assistant:

IfcStructuralSurfaceMemberVarying() : Object("IfcStructuralSurfaceMemberVarying") {}